

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_getc(BGZF *fp)

{
  byte bVar1;
  int iVar2;
  off_t oVar3;
  int c;
  BGZF *fp_local;
  
  if (fp->block_length <= fp->block_offset) {
    iVar2 = bgzf_read_block(fp);
    if (iVar2 != 0) {
      return -2;
    }
    if (fp->block_length == 0) {
      return -1;
    }
  }
  iVar2 = fp->block_offset;
  fp->block_offset = iVar2 + 1;
  bVar1 = *(byte *)((long)fp->uncompressed_block + (long)iVar2);
  if (fp->block_offset == fp->block_length) {
    oVar3 = htell(fp->fp);
    fp->block_address = oVar3;
    fp->block_offset = 0;
    fp->block_length = 0;
  }
  fp->uncompressed_address = fp->uncompressed_address + 1;
  return (uint)bVar1;
}

Assistant:

int bgzf_getc(BGZF *fp)
{
    int c;
    if (fp->block_offset >= fp->block_length) {
        if (bgzf_read_block(fp) != 0) return -2; /* error */
        if (fp->block_length == 0) return -1; /* end-of-file */
    }
    c = ((unsigned char*)fp->uncompressed_block)[fp->block_offset++];
    if (fp->block_offset == fp->block_length) {
        fp->block_address = htell(fp->fp);
        fp->block_offset = 0;
        fp->block_length = 0;
    }
    fp->uncompressed_address++;
    return c;
}